

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int calc_cookie_signature
              (ptls_t *tls,ptls_handshake_properties_t *properties,
              ptls_key_exchange_algorithm_t *negotiated_group,ptls_iovec_t tbs,uint8_t *sig)

{
  ulong local_a0;
  undefined1 local_91;
  uint8_t *puStack_90;
  uint8_t len8_3;
  size_t len_3;
  ulong uStack_80;
  uint8_t len8_2;
  size_t len_2;
  undefined2 local_70;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined2 local_6c;
  uint8_t b_1 [2];
  uint16_t v_1;
  uint8_t b [2];
  uint16_t v;
  uint8_t len8_1;
  size_t len_1;
  undefined8 uStack_58;
  uint8_t len8;
  size_t len;
  ptls_hash_context_t *hctx;
  ptls_hash_algorithm_t *algo;
  uint8_t *sig_local;
  ptls_key_exchange_algorithm_t *negotiated_group_local;
  ptls_handshake_properties_t *properties_local;
  ptls_t *tls_local;
  ptls_iovec_t tbs_local;
  
  tbs_local.base = (uint8_t *)tbs.len;
  tls_local = (ptls_t *)tbs.base;
  hctx = (ptls_hash_context_t *)(*tls->ctx->cipher_suites)->hash;
  algo = (ptls_hash_algorithm_t *)sig;
  sig_local = (uint8_t *)negotiated_group;
  negotiated_group_local = (ptls_key_exchange_algorithm_t *)properties;
  properties_local = (ptls_handshake_properties_t *)tls;
  len = (size_t)ptls_hmac_create((ptls_hash_algorithm_t *)hctx,
                                 (properties->field_0).server.cookie.key,
                                 ((ptls_hash_algorithm_t *)hctx)->digest_size);
  if ((ptls_hash_context_t *)len == (ptls_hash_context_t *)0x0) {
    tbs_local.len._4_4_ = 0x201;
  }
  else {
    uStack_58 = 0x20;
    len_1._7_1_ = 0x20;
    (*((ptls_hash_context_t *)len)->update)
              ((st_ptls_hash_context_t *)len,(void *)((long)&len_1 + 7),1);
    (**(code **)len)(len,(undefined1 *)((long)&properties_local[2].field_0 + 0x28),uStack_58);
    if (properties_local[2].field_0.client.negotiated_protocols.count == 0) {
      local_a0 = 0;
    }
    else {
      local_a0 = strlen((char *)properties_local[2].field_0.client.negotiated_protocols.count);
    }
    if (0xfe < local_a0) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0xe01,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    b_1[1] = (uint8_t)local_a0;
    (**(code **)len)(len,b_1 + 1,1);
    (**(code **)len)(len,properties_local[2].field_0.client.negotiated_protocols.count,local_a0);
    local_6c = (undefined2)*properties_local[2].field_0.client.max_early_data_size;
    local_6e = (undefined1)((ushort)local_6c >> 8);
    local_6d = (undefined1)local_6c;
    (**(code **)len)(len,&local_6e,2);
    local_70 = *(undefined2 *)sig_local;
    len_2._6_1_ = (undefined1)((ushort)local_70 >> 8);
    len_2._7_1_ = (undefined1)local_70;
    (**(code **)len)(len,(long)&len_2 + 6,2);
    uStack_80 = negotiated_group_local[2].data;
    if (0xfe < uStack_80) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0xe04,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    len_3._7_1_ = (undefined1)uStack_80;
    (**(code **)len)(len,(long)&len_3 + 7,1);
    (**(code **)len)(len,negotiated_group_local[2].exchange,uStack_80);
    puStack_90 = tbs_local.base;
    if ((uint8_t *)0xfe < tbs_local.base) {
      __assert_fail("len < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0xe06,
                    "int calc_cookie_signature(ptls_t *, ptls_handshake_properties_t *, ptls_key_exchange_algorithm_t *, ptls_iovec_t, uint8_t *)"
                   );
    }
    local_91 = SUB81(tbs_local.base,0);
    (**(code **)len)(len,&local_91,1);
    (**(code **)len)(len,tls_local,puStack_90);
    (**(code **)(len + 8))(len,algo,0);
    tbs_local.len._4_4_ = 0;
  }
  return tbs_local.len._4_4_;
}

Assistant:

static int calc_cookie_signature(ptls_t *tls, ptls_handshake_properties_t *properties,
                                 ptls_key_exchange_algorithm_t *negotiated_group, ptls_iovec_t tbs, uint8_t *sig)
{
    ptls_hash_algorithm_t *algo = tls->ctx->cipher_suites[0]->hash;
    ptls_hash_context_t *hctx;

    if ((hctx = ptls_hmac_create(algo, properties->server.cookie.key, algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

#define UPDATE_BLOCK(p, _len)                                                                                                      \
    do {                                                                                                                           \
        size_t len = (_len);                                                                                                       \
        assert(len < UINT8_MAX);                                                                                                   \
        uint8_t len8 = (uint8_t)len;                                                                                               \
        hctx->update(hctx, &len8, 1);                                                                                              \
        hctx->update(hctx, (p), len);                                                                                              \
    } while (0)
#define UPDATE16(_v)                                                                                                               \
    do {                                                                                                                           \
        uint16_t v = (_v);                                                                                                         \
        uint8_t b[2] = {v >> 8, v & 0xff};                                                                                         \
        hctx->update(hctx, b, 2);                                                                                                  \
    } while (0)

    UPDATE_BLOCK(tls->client_random, sizeof(tls->client_random));
    UPDATE_BLOCK(tls->server_name, tls->server_name != NULL ? strlen(tls->server_name) : 0);
    UPDATE16(tls->cipher_suite->id);
    UPDATE16(negotiated_group->id);
    UPDATE_BLOCK(properties->server.cookie.additional_data.base, properties->server.cookie.additional_data.len);

    UPDATE_BLOCK(tbs.base, tbs.len);

#undef UPDATE_BLOCK
#undef UPDATE16

    hctx->final(hctx, sig, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}